

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::DeregisterTemp(CConsole *this,char *pName)

{
  int iVar1;
  char *in_RDI;
  CCommand *pCommand;
  CCommand *pRemoved;
  char *in_stack_ffffffffffffffe0;
  char *a;
  long local_18;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    local_18 = 0;
    if (((*(byte *)(*(long *)(in_RDI + 0x28) + 0x34) & 1) == 0) ||
       (iVar1 = str_comp(in_stack_ffffffffffffffe0,in_RDI), iVar1 != 0)) {
      for (a = *(char **)(in_RDI + 0x28); *(long *)(a + 0x28) != 0; a = *(char **)(a + 0x28)) {
        if (((*(byte *)(*(long *)(a + 0x28) + 0x34) & 1) != 0) &&
           (iVar1 = str_comp(a,in_RDI), iVar1 == 0)) {
          local_18 = *(long *)(a + 0x28);
          *(undefined8 *)(a + 0x28) = *(undefined8 *)(*(long *)(a + 0x28) + 0x28);
          break;
        }
      }
    }
    else {
      local_18 = *(long *)(in_RDI + 0x28);
      *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 0x28);
    }
    if (local_18 != 0) {
      *(undefined8 *)(local_18 + 0x28) = *(undefined8 *)(in_RDI + 0x50);
      *(long *)(in_RDI + 0x50) = local_18;
    }
  }
  return;
}

Assistant:

void CConsole::DeregisterTemp(const char *pName)
{
	if(!m_pFirstCommand)
		return;

	CCommand *pRemoved = 0;

	// remove temp entry from command list
	if(m_pFirstCommand->m_Temp && str_comp(m_pFirstCommand->m_pName, pName) == 0)
	{
		pRemoved = m_pFirstCommand;
		m_pFirstCommand = m_pFirstCommand->m_pNext;
	}
	else
	{
		for(CCommand *pCommand = m_pFirstCommand; pCommand->m_pNext; pCommand = pCommand->m_pNext)
			if(pCommand->m_pNext->m_Temp && str_comp(pCommand->m_pNext->m_pName, pName) == 0)
			{
				pRemoved = pCommand->m_pNext;
				pCommand->m_pNext = pCommand->m_pNext->m_pNext;
				break;
			}
	}

	// add to recycle list
	if(pRemoved)
	{
		pRemoved->m_pNext = m_pRecycleList;
		m_pRecycleList = pRemoved;
	}
}